

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O3

void Gia_ManStaticFanoutTest(Gia_Man_t *p)

{
  Gia_Obj_t *pObj;
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  long lVar6;
  int iVar7;
  
  Gia_ManStaticFanoutStart(p);
  if (p->nObjs < 1) {
LAB_006de76d:
    Gia_ManStaticFanoutStop(p);
    return;
  }
  lVar6 = 0;
LAB_006de672:
  if (p->pObjs != (Gia_Obj_t *)0x0) {
    pObj = p->pObjs + lVar6;
    Gia_ObjPrint(p,pObj);
    printf("   Fanouts : ");
    pGVar5 = p->pObjs;
    if (pObj < pGVar5) {
LAB_006de7a2:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar7 = 0;
    do {
      if (pGVar5 + p->nObjs <= pObj) goto LAB_006de7a2;
      uVar4 = (int)((long)pObj - (long)pGVar5 >> 2) * -0x55555555;
      if (((int)uVar4 < 0) || (p->vFanoutNums->nSize <= (int)uVar4)) {
LAB_006de783:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vFanoutNums->pArray[uVar4 & 0x7fffffff] <= iVar7) goto LAB_006de753;
      uVar1 = p->vFanout->nSize;
      if ((int)uVar1 <= (int)uVar4) goto LAB_006de783;
      piVar3 = p->vFanout->pArray;
      uVar4 = piVar3[uVar4 & 0x7fffffff] + iVar7;
      if (((int)uVar4 < 0) || (uVar1 <= uVar4)) goto LAB_006de783;
      iVar2 = piVar3[uVar4];
      if ((iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      printf("%5d ");
      iVar7 = iVar7 + 1;
      pGVar5 = p->pObjs;
      if (pObj < pGVar5) goto LAB_006de7a2;
    } while( true );
  }
  goto LAB_006de76d;
LAB_006de753:
  putchar(10);
  lVar6 = lVar6 + 1;
  if (p->nObjs <= lVar6) goto LAB_006de76d;
  goto LAB_006de672;
}

Assistant:

void Gia_ManStaticFanoutTest( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pFanout;
    int i, k;
    Gia_ManStaticFanoutStart( p );
    Gia_ManForEachObj( p, pObj, i )
    {
        Gia_ObjPrint( p, pObj );
        printf( "   Fanouts : " );
        Gia_ObjForEachFanoutStatic( p, pObj, pFanout, k )
            printf( "%5d ", Gia_ObjId(p, pFanout) );
        printf( "\n" );
    }
    Gia_ManStaticFanoutStop( p );
}